

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage.c
# Opt level: O0

_Bool COSE_Mac_AddRecipient(HCOSE_MAC hMac,HCOSE_RECIPIENT hRecip,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor_errback local_50;
  cn_cbor_errback cbor_error;
  cn_cbor *pRecipientsT;
  cn_cbor *pRecipients;
  COSE_MacMessage *pMac;
  COSE_RecipientInfo *pRecip;
  cose_errback *perr_local;
  HCOSE_RECIPIENT hRecip_local;
  HCOSE_MAC hMac_local;
  
  cbor_error.pos = 0;
  cbor_error.err = CN_CBOR_NO_ERROR;
  _Var1 = IsValidMacHandle(hMac);
  if (_Var1) {
    _Var1 = IsValidRecipientHandle(hRecip);
    if (_Var1) {
      *(undefined8 *)(hRecip + 0x70) = *(undefined8 *)(hMac + 0x58);
      *(HCOSE_RECIPIENT *)(hMac + 0x58) = hRecip;
      pRecipientsT = _COSE_arrayget_int((COSE *)hMac,4);
      if (pRecipientsT == (cn_cbor *)0x0) {
        cbor_error = (cn_cbor_errback)cn_cbor_array_create(&local_50);
        if (cbor_error == (cn_cbor_errback)0x0) {
          if (perr != (cose_errback *)0x0) {
            cVar2 = _MapFromCBOR(local_50);
            perr->err = cVar2;
          }
          goto LAB_0026111a;
        }
        _Var1 = _COSE_array_replace((COSE *)hMac,(cn_cbor *)cbor_error,4,&local_50);
        if (!_Var1) {
          if (perr != (cose_errback *)0x0) {
            cVar2 = _MapFromCBOR(local_50);
            perr->err = cVar2;
          }
          goto LAB_0026111a;
        }
        pRecipientsT = (cn_cbor *)cbor_error;
        cbor_error.pos = 0;
        cbor_error.err = CN_CBOR_NO_ERROR;
      }
      _Var1 = cn_cbor_array_append(pRecipientsT,*(cn_cbor **)(hRecip + 0x18),&local_50);
      if (_Var1) {
        *(int *)(hRecip + 0x10) = *(int *)(hRecip + 0x10) + 1;
        return true;
      }
      if (perr != (cose_errback *)0x0) {
        cVar2 = _MapFromCBOR(local_50);
        perr->err = cVar2;
      }
    }
    else if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_PARAMETER;
  }
LAB_0026111a:
  if (cbor_error == (cn_cbor_errback)0x0) {
    cn_cbor_free((cn_cbor *)0x0);
  }
  return false;
}

Assistant:

bool COSE_Mac_AddRecipient(HCOSE_MAC hMac, HCOSE_RECIPIENT hRecip, cose_errback * perr)
{
	COSE_RecipientInfo * pRecip;
	COSE_MacMessage * pMac;
	cn_cbor * pRecipients = NULL;
	cn_cbor * pRecipientsT = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif
	cn_cbor_errback cbor_error;

	CHECK_CONDITION(IsValidMacHandle(hMac), COSE_ERR_INVALID_PARAMETER);
	CHECK_CONDITION(IsValidRecipientHandle(hRecip), COSE_ERR_INVALID_PARAMETER);

	pMac = (COSE_MacMessage *)hMac;
	pRecip = (COSE_RecipientInfo *)hRecip;

	pRecip->m_recipientNext = pMac->m_recipientFirst;
	pMac->m_recipientFirst = pRecip;

#ifdef USE_CBOR_CONTEXT
	context = &pMac->m_message.m_allocContext;
#endif // USE_CBOR_CONTEXT

	pRecipients = _COSE_arrayget_int(&pMac->m_message, INDEX_MAC_RECIPIENTS);
	if (pRecipients == NULL) {
		pRecipientsT = cn_cbor_array_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(pRecipientsT != NULL, cbor_error);

		CHECK_CONDITION_CBOR(_COSE_array_replace(&pMac->m_message, pRecipientsT, INDEX_MAC_RECIPIENTS, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
		pRecipients = pRecipientsT;
		pRecipientsT = NULL;
	}

	CHECK_CONDITION_CBOR(cn_cbor_array_append(pRecipients, pRecip->m_encrypt.m_message.m_cbor, &cbor_error), cbor_error);
	pRecip->m_encrypt.m_message.m_refCount++;

	return true;

errorReturn:
	if (pRecipientsT == NULL) CN_CBOR_FREE(pRecipientsT, context);
	return false;
}